

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::_internal_add_values
          (TensorValue_RepeatedBools *this,bool value)

{
  bool local_11;
  TensorValue_RepeatedBools *pTStack_10;
  bool value_local;
  TensorValue_RepeatedBools *this_local;
  
  local_11 = value;
  pTStack_10 = this;
  google::protobuf::RepeatedField<bool>::Add(&this->values_,&local_11);
  return;
}

Assistant:

inline void TensorValue_RepeatedBools::_internal_add_values(bool value) {
  values_.Add(value);
}